

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

Node * __thiscall State::LookupNode(State *this,StringPiece path)

{
  Metrics *this_00;
  int iVar1;
  const_iterator cVar2;
  Metric *pMVar3;
  Node *pNVar4;
  ScopedMetric metrics_h_scoped;
  string local_60;
  ScopedMetric local_40;
  key_type local_30;
  
  local_30.len_ = path.len_;
  local_30.str_ = path.str_;
  if ((LookupNode(StringPiece)::metrics_h_metric == '\0') &&
     (iVar1 = __cxa_guard_acquire(&LookupNode(StringPiece)::metrics_h_metric), this_00 = g_metrics,
     iVar1 != 0)) {
    if (g_metrics == (Metrics *)0x0) {
      pMVar3 = (Metric *)0x0;
    }
    else {
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"lookup node","");
      pMVar3 = Metrics::NewMetric(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
    LookupNode::metrics_h_metric = pMVar3;
    __cxa_guard_release(&LookupNode(StringPiece)::metrics_h_metric);
  }
  ScopedMetric::ScopedMetric(&local_40,LookupNode::metrics_h_metric);
  cVar2 = std::
          _Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find((_Hashtable<StringPiece,_std::pair<const_StringPiece,_Node_*>,_std::allocator<std::pair<const_StringPiece,_Node_*>_>,_std::__detail::_Select1st,_std::equal_to<StringPiece>,_std::hash<StringPiece>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                  *)this,&local_30);
  if (cVar2.super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>._M_cur ==
      (__node_type *)0x0) {
    pNVar4 = (Node *)0x0;
  }
  else {
    pNVar4 = *(Node **)((long)cVar2.
                              super__Node_iterator_base<std::pair<const_StringPiece,_Node_*>,_true>.
                              _M_cur + 0x18);
  }
  ScopedMetric::~ScopedMetric(&local_40);
  return pNVar4;
}

Assistant:

Node* State::LookupNode(StringPiece path) const {
  METRIC_RECORD("lookup node");
  Paths::const_iterator i = paths_.find(path);
  if (i != paths_.end())
    return i->second;
  return NULL;
}